

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::EmitCompoundArith(SQCompiler *this,SQInteger tok,SQInteger etype,SQInteger pos)

{
  ulong uVar1;
  SQInteger SVar2;
  SQInteger arg1;
  long in_RDX;
  SQInteger in_RSI;
  SQCompiler *in_RDI;
  SQInteger tmp;
  SQInteger val_1;
  SQInteger src;
  SQInteger key;
  SQInteger val;
  SQInteger p1;
  SQInteger p2;
  SQInteger in_stack_ffffffffffffff60;
  SQFuncState *pSVar3;
  SQFuncState *in_stack_ffffffffffffff68;
  SQFuncState *this_00;
  SQFuncState *in_stack_ffffffffffffff70;
  SQInteger in_stack_ffffffffffffff78;
  SQInteger in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  SQOpcode SVar4;
  SQFuncState *in_stack_ffffffffffffff90;
  
  SVar4 = (SQOpcode)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RDX - 2U < 2) {
    uVar1 = SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    SVar2 = SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    SVar4 = (SQOpcode)((ulong)SVar2 >> 0x20);
    SVar2 = SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    pSVar3 = in_RDI->_fs;
    arg1 = SQFuncState::PushTarget(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    uVar1 = SVar2 << 0x10 | uVar1;
    ChooseCompArithCharByToken(in_RDI,in_RSI);
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffff90,SVar4,uVar1,arg1,(SQInteger)pSVar3,
               (SQInteger)in_stack_ffffffffffffff68);
  }
  else if (in_RDX == 4) {
    SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    SQFuncState::PushTarget(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    pSVar3 = in_RDI->_fs;
    ChooseArithOpByToken(in_RDI,in_RSI);
    SQFuncState::AddInstruction
              (pSVar3,SVar4,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (SQInteger)in_stack_ffffffffffffff70,(SQInteger)in_stack_ffffffffffffff68);
    SQFuncState::SnoozeOpt(in_RDI->_fs);
  }
  else if (in_RDX == 5) {
    SQFuncState::TopTarget((SQFuncState *)0x12a33d);
    SQFuncState::PushTarget(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffff90,SVar4,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (SQInteger)in_stack_ffffffffffffff70,(SQInteger)in_stack_ffffffffffffff68);
    pSVar3 = in_RDI->_fs;
    ChooseArithOpByToken(in_RDI,in_RSI);
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffff90,SVar4,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (SQInteger)in_stack_ffffffffffffff70,(SQInteger)in_stack_ffffffffffffff68);
    SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    SQFuncState::PopTarget(in_stack_ffffffffffffff70);
    this_00 = in_RDI->_fs;
    SQFuncState::PushTarget(this_00,(SQInteger)pSVar3);
    SQFuncState::AddInstruction
              (in_stack_ffffffffffffff90,SVar4,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (SQInteger)in_stack_ffffffffffffff70,(SQInteger)this_00);
  }
  return;
}

Assistant:

void EmitCompoundArith(SQInteger tok, SQInteger etype, SQInteger pos)
    {
        /* Generate code depending on the expression type */
        switch(etype) {
        case LOCAL:{
            SQInteger p2 = _fs->PopTarget(); //src in OP_GET
            SQInteger p1 = _fs->PopTarget(); //key in OP_GET
            _fs->PushTarget(p1);
            //EmitCompArithLocal(tok, p1, p1, p2);
            _fs->AddInstruction(ChooseArithOpByToken(tok),p1, p2, p1, 0);
            _fs->SnoozeOpt();
                   }
            break;
        case OBJECT:
        case BASE:
            {
                SQInteger val = _fs->PopTarget();
                SQInteger key = _fs->PopTarget();
                SQInteger src = _fs->PopTarget();
                /* _OP_COMPARITH mixes dest obj and source val in the arg1 */
                _fs->AddInstruction(_OP_COMPARITH, _fs->PushTarget(), (src<<16)|val, key, ChooseCompArithCharByToken(tok));
            }
            break;
        case OUTER:
            {
                SQInteger val = _fs->TopTarget();
                SQInteger tmp = _fs->PushTarget();
                _fs->AddInstruction(_OP_GETOUTER,   tmp, pos);
                _fs->AddInstruction(ChooseArithOpByToken(tok), tmp, val, tmp, 0);
                _fs->PopTarget();
                _fs->PopTarget();
                _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, tmp);
            }
            break;
        }
    }